

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<FileInfoCacheKey,QFileInfo>::emplace<QFileInfo_const&>
          (QHash<FileInfoCacheKey,QFileInfo> *this,FileInfoCacheKey *key,QFileInfo *args)

{
  Data<QHashPrivate::Node<FileInfoCacheKey,_QFileInfo>_> *pDVar1;
  long in_FS_OFFSET;
  piter pVar2;
  QHash<FileInfoCacheKey,_QFileInfo> local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data<QHashPrivate::Node<FileInfoCacheKey,_QFileInfo>_> **)this;
  if (pDVar1 == (Data<QHashPrivate::Node<FileInfoCacheKey,_QFileInfo>_> *)0x0) {
    local_30.d = (Data<QHashPrivate::Node<FileInfoCacheKey,_QFileInfo>_> *)0x0;
LAB_0018eba2:
    pDVar1 = (Data<QHashPrivate::Node<FileInfoCacheKey,_QFileInfo>_> *)0x0;
LAB_0018ebc4:
    pDVar1 = QHashPrivate::Data<QHashPrivate::Node<FileInfoCacheKey,_QFileInfo>_>::detached(pDVar1);
    *(Data<QHashPrivate::Node<FileInfoCacheKey,_QFileInfo>_> **)this = pDVar1;
LAB_0018ebcc:
    pVar2 = (piter)emplace_helper<QFileInfo_const&>(this,key,args);
    QHash<FileInfoCacheKey,_QFileInfo>::~QHash(&local_30);
  }
  else {
    if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      local_30.d = pDVar1;
      if ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pDVar1 = *(Data<QHashPrivate::Node<FileInfoCacheKey,_QFileInfo>_> **)this;
        if (pDVar1 == (Data<QHashPrivate::Node<FileInfoCacheKey,_QFileInfo>_> *)0x0)
        goto LAB_0018eba2;
      }
      if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) goto LAB_0018ebc4;
      goto LAB_0018ebcc;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        pVar2 = (piter)emplace_helper<QFileInfo_const&>(this,key,args);
        return (iterator)pVar2;
      }
      goto LAB_0018ec3a;
    }
    QFileInfo::QFileInfo((QFileInfo *)&local_30,args);
    pVar2 = (piter)QHash<FileInfoCacheKey,_QFileInfo>::emplace_helper<QFileInfo>
                             ((QHash<FileInfoCacheKey,_QFileInfo> *)this,key,(QFileInfo *)&local_30)
    ;
    QFileInfo::~QFileInfo((QFileInfo *)&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (iterator)pVar2;
  }
LAB_0018ec3a:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }